

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O3

size_t beltFMTCalcB(u32 mod,size_t count)

{
  word *b;
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong w;
  word den [2];
  word num [2];
  word stack [10];
  size_t local_a8 [2];
  word local_98 [4];
  word local_78 [2];
  word local_68 [2];
  word local_58 [2];
  word local_48 [3];
  
  sVar3 = 0x27;
  if (mod != 0xc203 || count != 0x140) {
    if (mod == 0x10000) {
      sVar3 = count * 0x10 + 0x3f >> 6;
    }
    else {
      w = (ulong)mod;
      sVar2 = u64CLZ(w);
      sVar3 = 0x3f - sVar2;
      if ((1 << (-(byte)sVar2 & 0x1f)) - mod <= (-1 << (~(byte)sVar2 & 0x1f)) + mod) {
        sVar3 = 0x40 - sVar2;
      }
      wwSetZero(local_98 + 2,2);
      wwSetBit(local_98 + 2,sVar3 * 3,1);
      wwSetZero(local_78,2);
      wwSetBit(local_78,sVar3 * 2,1);
      zzMulW(local_78,local_78,2,w);
      wwSetZero(local_68,2);
      wwSetBit(local_68,sVar3,1);
      zzMulW(local_68,local_68,2,w);
      zzMulW(local_68,local_68,2,w);
      wwSetW(local_58,2,w);
      zzMulW(local_58,local_58,2,w);
      zzMulW(local_58,local_58,2,w);
      wwCopy(local_a8,local_98 + 2,2);
      zzAdd2(local_a8,local_58,2);
      wwCopy(local_48,local_78,2);
      zzAdd2(local_48,local_68,2);
      zzMulW(local_48,local_48,2,9);
      zzAdd2(local_a8,local_48,2);
      wwCopy(local_98,local_a8,2);
      zzMulW(local_98,local_98,2,0x129c);
      b = local_98 + 2;
      zzMulW(local_98,local_98,2,sVar3);
      zzMulW(local_58,local_58,2,0x6271);
      zzAdd2(local_98,local_58,2);
      zzMulW(local_68,local_68,2,0xf1a1);
      zzAdd2(local_98,local_68,2);
      zzMulW(local_78,local_78,2,0xf1a1);
      zzSub2(local_98,local_78,2);
      zzMulW(b,b,2,0x6271);
      zzSub2(local_98,b,2);
      zzMulW(local_98,local_98,2,count);
      zzMulW(local_a8,local_a8,2,0x300);
      zzMulW(local_a8,local_a8,2,0x18d);
      zzAdd2(local_98,local_a8,2);
      zzSubW2(local_98,2,1);
      sVar3 = 3;
      do {
        lVar1 = sVar3 - 4;
        sVar3 = sVar3 - 1;
      } while (local_98[lVar1] == 0);
      zzDiv(local_a8,local_98,local_98,2,local_a8,sVar3,b);
      sVar3 = local_a8[0];
    }
  }
  return sVar3;
}

Assistant:

static size_t beltFMTCalcB(u32 mod, size_t count)
{
	const size_t m = W_OF_B(128);
	word num[W_OF_B(128)];
	word den[W_OF_B(128)];
	size_t k;
	word stack[W_OF_B(128) * 5];
	word* t0 = stack; 
	word* t1 = t0 + m; 
	word* t2 = t1 + m; 
	word* t3 = t2 + m; 
	word* t4 = t3 + m; 
	// pre
	ASSERT(2 <= mod && mod <= 65536);
	ASSERT(1 <= count && count <= 300);
	// обработать особые сочетания (mod, count)
	if (mod == 49667 && count == 320)
		return 39;
	// обработать mod, который не умещается в 16 битов
	if (mod == 65536)
		return (16 * count + 63) / 64;
	// k <- ceil(log2(mod))
	k = B_PER_W - wordCLZ((word)mod);
	ASSERT(k > 0);
	if ((U32_1 << k) - mod > mod - (U32_1 << (k - 1)))
		--k;
	// t0 <- 8^k
	wwSetZero(t0, m);
	wwSetBit(t0, 3 * k, 1);
	// t1 <- 4^k mod 
	wwSetZero(t1, m);
	wwSetBit(t1, 2 * k, 1);
	zzMulW(t1, t1, m, mod);
	// t2 <- 2^k mod^2
	wwSetZero(t2, m);
	wwSetBit(t2, k, 1);
	zzMulW(t2, t2, m, mod);
	zzMulW(t2, t2, m, mod);
	// t3 <- mod^3
	wwSetW(t3, m, mod);
	zzMulW(t3, t3, m, mod);
	zzMulW(t3, t3, m, mod);
	// den <- t0 + 9 * t1 + 9 * t2 + t3
	wwCopy(den, t0, m);
	zzAdd2(den, t3, m);
	wwCopy(t4, t1, m);
	zzAdd2(t4, t2, m);
	zzMulW(t4, t4, m, 9);
	zzAdd2(den, t4, m);
	// num <- den * 4767 k 
	wwCopy(num, den, m);
	zzMulW(num, num, m, 4764);
	zzMulW(num, num, m, (word)k);
	// num <- count * (num - 25201 t0 - 61857 t1 + 61857 t2 + 25201 t3)
	zzMulW(t3, t3, m, 25201);
	zzAdd2(num, t3, m);
	zzMulW(t2, t2, m, 61857u);
	zzAdd2(num, t2, m);
	zzMulW(t1, t1, m, 61857u);
	zzSub2(num, t1, m);
	zzMulW(t0, t0, m, 25201);
	zzSub2(num, t0, m);
	zzMulW(num, num, m, (word)count);
	// den <- 304896 * den
	zzMulW(den, den, m, 768);
	zzMulW(den, den, m, 397);
	// num <- num + den - 1
	zzAdd2(num, den, m);
	zzSubW2(num, m, 1);
	// num <- num / den
	for (k = m; den[k - 1] == 0; --k);
	ASSERT(zzDiv_deep(m, k) <= sizeof(stack));
	zzDiv(den, num, num, m, den, k, stack);
	// возврат
	return (size_t)den[0];
}